

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O1

void BubbleSort(vector<int,_std::allocator<int>_> *sortArray)

{
  pointer piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  vector<int,_std::allocator<int>_> *retVector;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 *apuStack_2a8 [2];
  undefined1 auStack_298 [16];
  undefined1 *puStack_288;
  long lStack_280;
  undefined1 auStack_278 [16];
  string sStack_268;
  long lStack_248;
  filebuf afStack_240 [240];
  ios_base aiStack_150 [264];
  clock_t cStack_48;
  
  cStack_48 = clock();
  piVar1 = (sortArray->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(sortArray->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  uVar7 = (int)uVar6 - 1;
  if (-1 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
    do {
      if (0 < (long)uVar9) {
        uVar8 = 0;
        do {
          if (uVar6 == uVar8) {
LAB_00102558:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
            puStack_288 = auStack_278;
            std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_288,"","");
            apuStack_2a8[0] = auStack_298;
            std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_2a8,"","");
            while( true ) {
              iVar4 = std::__cxx11::string::compare((char *)&puStack_288);
              if (iVar4 != 0) break;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "Please type the filename that you would like to sort: ",0x36);
              cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)&puStack_288,cVar3);
            }
            retVector = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
            (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            sStack_268._M_dataplus._M_p = (pointer)&sStack_268.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&sStack_268,puStack_288,puStack_288 + lStack_280);
            ReadFile(&sStack_268,retVector);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_268._M_dataplus._M_p != &sStack_268.field_2) {
              operator_delete(sStack_268._M_dataplus._M_p);
            }
            if ((retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish ==
                (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"File does not exist!",0x14);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
              std::ostream::put(-0x30);
              std::ostream::flush();
            }
            BubbleSort(retVector);
            while( true ) {
              iVar4 = std::__cxx11::string::compare((char *)apuStack_2a8);
              if (iVar4 != 0) break;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"File sorted. Output to filename: ",0x21);
              cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)apuStack_2a8,cVar3);
            }
            std::ofstream::ofstream(&lStack_248);
            std::ofstream::open((char *)&lStack_248,(_Ios_Openmode)apuStack_2a8[0]);
            if ((retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish !=
                (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              uVar6 = 0;
              do {
                std::ostream::put((char)&lStack_248);
                uVar6 = uVar6 + 1;
              } while (uVar6 < (ulong)((long)(retVector->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish -
                                       (long)(retVector->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start >> 2));
            }
            std::ofstream::close();
            lStack_248 = _VTT;
            *(undefined8 *)(afStack_240 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
            std::filebuf::~filebuf(afStack_240);
            std::ios_base::~ios_base(aiStack_150);
            if (apuStack_2a8[0] != auStack_298) {
              operator_delete(apuStack_2a8[0]);
            }
            if (puStack_288 != auStack_278) {
              operator_delete(puStack_288);
            }
            return;
          }
          if ((uVar6 - 1) + (ulong)(uVar6 == 0) == uVar8) {
            uVar8 = uVar8 + 1;
            goto LAB_00102558;
          }
          iVar4 = piVar1[uVar8];
          if (piVar1[uVar8 + 1] < iVar4) {
            piVar1[uVar8] = piVar1[uVar8 + 1];
            piVar1[uVar8 + 1] = (int)(char)iVar4;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      bVar2 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar2);
  }
  clock();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time was ",0xf);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," processor cycles.",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void BubbleSort(std::vector<int> *sortArray)
{
    std::clock_t t;
    t = clock();
    for(int i = sortArray->size() - 1; i > - 1; i--)
    {
        for(int j = 0; j < i; j++)
        {
            if(sortArray->at(j) < sortArray->at(j + 1) || sortArray->at(j) == sortArray->at(j + 1))
            {
                continue;
            }
            else
            {
                char tmp = sortArray->at(j);
                sortArray->at(j) = sortArray->at(j + 1);
                sortArray->at(j + 1) = tmp;
            }
        }
    }

    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;
}